

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_3.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  void *pvVar1;
  void *ptr_1;
  CachedMemCtx memCtx_1;
  void *ptr;
  CachedMemCtx memCtx;
  NoActionMemLogger local_39;
  undefined1 local_38 [7];
  NoActionMemLogger logger;
  CachedArena<cookmem::MmapArena> cachedArena;
  MmapArena arena;
  char **argv_local;
  int argc_local;
  
  cookmem::MmapArena::MmapArena((MmapArena *)&cachedArena.m_tree,0x10000,3,0x22);
  cookmem::CachedArena<cookmem::MmapArena>::CachedArena
            ((CachedArena<cookmem::MmapArena> *)local_38,(MmapArena *)&cachedArena.m_tree);
  cookmem::NoActionMemLogger::NoActionMemLogger(&local_39);
  cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  MemContext((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
              *)&ptr,(CachedArena<cookmem::MmapArena> *)local_38,&local_39,false);
  memCtx_1.m_pool._576_8_ =
       cookmem::
       MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
       allocate((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                 *)&ptr,100);
  memCtx_1.m_pool._576_8_ =
       cookmem::
       MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
       reallocate((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                   *)&ptr,(void *)memCtx_1.m_pool._576_8_,1000);
  cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  deallocate((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
              *)&ptr,(void *)memCtx_1.m_pool._576_8_,0);
  cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  ~MemContext((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
               *)&ptr);
  cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  MemContext((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
              *)&ptr_1,(CachedArena<cookmem::MmapArena> *)local_38,&local_39,false);
  pvVar1 = cookmem::
           MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           allocate((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                     *)&ptr_1,100);
  pvVar1 = cookmem::
           MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           reallocate((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                       *)&ptr_1,pvVar1,1000);
  cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  deallocate((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
              *)&ptr_1,pvVar1,0);
  cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
  ~MemContext((MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
               *)&ptr_1);
  cookmem::CachedArena<cookmem::MmapArena>::~CachedArena
            ((CachedArena<cookmem::MmapArena> *)local_38);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    cookmem::MmapArena arena;
    cookmem::CachedArena<cookmem::MmapArena> cachedArena (arena);
    cookmem::NoActionMemLogger logger;

    typedef cookmem::MemContext<cookmem::CachedArena<cookmem::MmapArena>, cookmem::NoActionMemLogger> CachedMemCtx;

    {
        CachedMemCtx memCtx (cachedArena, logger);

        // Allocate memory
        void* ptr = memCtx.allocate (100);

        // Change the size of the memory
        ptr = memCtx.reallocate (ptr, 1000);

        // Free the memory
        memCtx.deallocate (ptr);

        // Destructor of MemContext is called to release all allocated memory
        // segments back to cachedArena
    }

    {
        CachedMemCtx memCtx (cachedArena, logger);

        // Allocate memory.  The memory segment saved in cachedArena are re-used.
        void* ptr = memCtx.allocate (100);

        // Change the size of the memory
        ptr = memCtx.reallocate (ptr, 1000);

        // Free the memory
        memCtx.deallocate (ptr);

        // Destructor of MemContext is called to release all allocated memory
        // segments back to cachedArena
    }
    return 0;
}